

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_marshal(uint8_t *out,poly *in)

{
  ulong local_28;
  size_t i;
  uint16_t *p;
  poly *in_local;
  uint8_t *out_local;
  
  i = (size_t)in;
  in_local = (poly *)out;
  for (local_28 = 0; local_28 < 0x57; local_28 = local_28 + 1) {
    *(char *)&in_local->field_0 = (char)*(undefined2 *)i;
    *(byte *)((long)&in_local->field_0 + 1) =
         (byte)((ushort)*(undefined2 *)i >> 8) & 0x1f | (byte)((*(ushort *)(i + 2) & 7) << 5);
    *(char *)((long)&in_local->field_0 + 2) = (char)((int)(uint)*(ushort *)(i + 2) >> 3);
    *(byte *)((long)&in_local->field_0 + 3) =
         (byte)((int)(uint)*(ushort *)(i + 2) >> 0xb) & 3 | (byte)((*(ushort *)(i + 4) & 0x3f) << 2)
    ;
    *(byte *)((long)&in_local->field_0 + 4) =
         (byte)((int)(uint)*(ushort *)(i + 4) >> 6) & 0x7f | (byte)((*(ushort *)(i + 6) & 1) << 7);
    *(char *)((long)&in_local->field_0 + 5) = (char)((int)(uint)*(ushort *)(i + 6) >> 1);
    *(byte *)((long)&in_local->field_0 + 6) =
         (byte)((int)(uint)*(ushort *)(i + 6) >> 9) & 0xf | (byte)((*(ushort *)(i + 8) & 0xf) << 4);
    *(char *)((long)&in_local->field_0 + 7) = (char)((int)(uint)*(ushort *)(i + 8) >> 4);
    *(byte *)((long)&in_local->field_0 + 8) =
         (byte)((int)(uint)*(ushort *)(i + 8) >> 0xc) & 1 |
         (byte)((*(ushort *)(i + 10) & 0x7f) << 1);
    *(byte *)((long)&in_local->field_0 + 9) =
         (byte)((int)(uint)*(ushort *)(i + 10) >> 7) & 0x3f |
         (byte)((*(ushort *)(i + 0xc) & 3) << 6);
    *(char *)((long)&in_local->field_0 + 10) = (char)((int)(uint)*(ushort *)(i + 0xc) >> 2);
    *(byte *)((long)&in_local->field_0 + 0xb) =
         (byte)((int)(uint)*(ushort *)(i + 0xc) >> 10) & 7 |
         (byte)((*(ushort *)(i + 0xe) & 0x1f) << 3);
    *(char *)((long)&in_local->field_0 + 0xc) = (char)((int)(uint)*(ushort *)(i + 0xe) >> 5);
    i = i + 0x10;
    in_local = (poly *)((long)&in_local->field_0 + 0xd);
  }
  *(char *)&in_local->field_0 = (char)*(undefined2 *)i;
  *(byte *)((long)&in_local->field_0 + 1) =
       (byte)((ushort)*(undefined2 *)i >> 8) & 0x1f | (byte)((*(ushort *)(i + 2) & 7) << 5);
  *(char *)((long)&in_local->field_0 + 2) = (char)((int)(uint)*(ushort *)(i + 2) >> 3);
  *(byte *)((long)&in_local->field_0 + 3) =
       (byte)((int)(uint)*(ushort *)(i + 2) >> 0xb) & 3 | (byte)((*(ushort *)(i + 4) & 0x3f) << 2);
  *(byte *)((long)&in_local->field_0 + 4) =
       (byte)((int)(uint)*(ushort *)(i + 4) >> 6) & 0x7f | (byte)((*(ushort *)(i + 6) & 1) << 7);
  *(char *)((long)&in_local->field_0 + 5) = (char)((int)(uint)*(ushort *)(i + 6) >> 1);
  *(byte *)((long)&in_local->field_0 + 6) = (byte)((int)(uint)*(ushort *)(i + 6) >> 9) & 0xf;
  return;
}

Assistant:

static void poly_marshal(uint8_t out[POLY_BYTES], const struct poly *in) {
  const uint16_t *p = in->v;

  for (size_t i = 0; i < N / 8; i++) {
    out[0] = p[0];
    out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
    out[2] = p[1] >> 3;
    out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
    out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
    out[5] = p[3] >> 1;
    out[6] = (0xf & (p[3] >> 9)) | ((p[4] & 0x0f) << 4);
    out[7] = p[4] >> 4;
    out[8] = (1 & (p[4] >> 12)) | ((p[5] & 0x7f) << 1);
    out[9] = (0x3f & (p[5] >> 7)) | ((p[6] & 0x03) << 6);
    out[10] = p[6] >> 2;
    out[11] = (7 & (p[6] >> 10)) | ((p[7] & 0x1f) << 3);
    out[12] = p[7] >> 5;

    p += 8;
    out += 13;
  }

  // There are four remaining values.
  out[0] = p[0];
  out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
  out[2] = p[1] >> 3;
  out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
  out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
  out[5] = p[3] >> 1;
  out[6] = 0xf & (p[3] >> 9);
}